

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::BitfieldReverseCase::compare
          (BitfieldReverseCase *this,void **inputs,void **outputs)

{
  uint uVar1;
  DataType dataType;
  Precision precision_00;
  int integerLength_00;
  int iVar2;
  deUint32 dVar3;
  deUint32 value_00;
  reference pvVar4;
  ostream *poVar5;
  Hex<8UL> hex;
  deUint32 ref;
  deInt32 out;
  deUint32 value;
  int compNdx;
  deUint32 cmpMask;
  int scalarSize;
  int integerLength;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  BitfieldReverseCase *this_local;
  
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar4->varType);
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  precision_00 = glu::VarType::getPrecision(&pvVar4->varType);
  integerLength_00 =
       anon_unknown_3::getShaderUintBitCount
                 ((this->super_IntegerFunctionCase).m_shaderType,precision_00);
  iVar2 = glu::getDataTypeScalarSize(dataType);
  dVar3 = anon_unknown_3::getLowBitMask(integerLength_00);
  dVar3 = reverseBits(dVar3);
  out = 0;
  while( true ) {
    if (iVar2 <= out) {
      return true;
    }
    uVar1 = *(uint *)((long)*outputs + (long)out * 4);
    value_00 = reverseBits(*(deUint32 *)((long)*inputs + (long)out * 4));
    if ((uVar1 & dVar3) != (value_00 & dVar3)) break;
    out = out + 1;
  }
  poVar5 = std::operator<<((ostream *)&(this->super_IntegerFunctionCase).m_failMsg,"Expected [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,out);
  poVar5 = std::operator<<(poVar5,"] = ");
  hex = tcu::toHex<unsigned_int>(value_00);
  tcu::Format::operator<<(poVar5,hex);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			cmpMask			= reverseBits(getLowBitMask(integerLength));

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	ref		= reverseBits(value);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}